

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

uint16_t chk_flags(char *s)

{
  int iVar1;
  long in_RDI;
  uint16_t local_2;
  
  iVar1 = strcmp((char *)(in_RDI + 5),"deluscore");
  if (iVar1 == 0) {
    local_2 = 1;
  }
  else {
    iVar1 = strcmp((char *)(in_RDI + 5),"adduscore");
    if (iVar1 == 0) {
      local_2 = 2;
    }
    else {
      error(2,in_RDI);
      local_2 = 0;
    }
  }
  return local_2;
}

Assistant:

static uint16_t chk_flags(char *s)
/* check for input-file flags */
{
  if (!strcmp(s+5,"deluscore"))
    return IFF_DELUNDERSCORE;

  else if (!strcmp(s+5,"adduscore"))
    return IFF_ADDUNDERSCORE;

  error(2,s);
  return 0;
}